

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int attr_count(attr_list list)

{
  int iVar1;
  short *in_RDI;
  int i;
  int count;
  int iVar2;
  int local_4;
  
  if (in_RDI == (short *)0x0) {
    local_4 = 0;
  }
  else if (*in_RDI == 0) {
    local_4 = (uint)*(byte *)(*(long *)(in_RDI + 8) + 1) +
              (uint)*(byte *)(*(long *)(in_RDI + 8) + 2);
  }
  else {
    local_4 = 0;
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 4); iVar2 = iVar2 + 1) {
      iVar1 = attr_count((attr_list)CONCAT44(local_4,iVar2));
      local_4 = iVar1 + local_4;
    }
  }
  return local_4;
}

Assistant:

extern
int 
attr_count(attr_list list)
{
    if (list == NULL) return 0;
    if (!list->list_of_lists) {
        return list->l.list.iattrs->int_attr_count +
	    list->l.list.iattrs->other_attr_count;
    } else {
        int count = 0;
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            count += attr_count(list->l.lists.lists[i]);
        }
        return count;
    }           
}